

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

void qpdf_oh_replace_key(qpdf_data qpdf,qpdf_oh oh,char *key,qpdf_oh item)

{
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(qpdf_data *)local_48._M_unused._0_8_ = qpdf;
  *(char **)((long)local_48._M_unused._0_8_ + 8) = key;
  *(qpdf_oh *)((long)local_48._M_unused._0_8_ + 0x10) = item;
  local_30 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1636:31)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1636:31)>
             ::_M_manager;
  do_with_oh_void(qpdf,oh,(function<void_(QPDFObjectHandle_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdf_oh_replace_key(qpdf_data qpdf, qpdf_oh oh, char const* key, qpdf_oh item)
{
    do_with_oh_void(qpdf, oh, [qpdf, key, item](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_replace_key");
        o.replaceKey(key, qpdf_oh_item_internal(qpdf, item));
    });
}